

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,IfElseStatement *ptr)

{
  Expr *second;
  Statement *pSVar1;
  IfElseStatement *pIVar2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  IfElseStatement *local_18;
  IfElseStatement *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (IfElseStatement *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"if else statement",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pIVar2 = local_18;
  second = local_18->condition;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"condition",&local_71);
  arrow(this,pIVar2,second,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  (**(local_18->condition->super_Base)._vptr_Base)(local_18->condition,this);
  pIVar2 = local_18;
  pSVar1 = local_18->do_if_true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"true",&local_99);
  arrow(this,pIVar2,pSVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  (**(local_18->do_if_true->super_Base)._vptr_Base)(local_18->do_if_true,this);
  pIVar2 = local_18;
  pSVar1 = local_18->do_else;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"else",&local_c1);
  arrow(this,pIVar2,pSVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  (**(local_18->do_else->super_Base)._vptr_Base)(local_18->do_else,this);
  return;
}

Assistant:

void gv_visitor::visit(IfElseStatement* ptr) {
    box(ptr, "if else statement");
    arrow(ptr, ptr->condition, "condition");
    ptr->condition->accept(this);
    arrow(ptr, ptr->do_if_true, "true");
    ptr->do_if_true->accept(this);
    arrow(ptr, ptr->do_else, "else");
    ptr->do_else->accept(this);
}